

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledItem::~IfcStyledItem(IfcStyledItem *this,void **vtt)

{
  void **vtt_local;
  IfcStyledItem *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[7];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[8];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->Name);
  STEP::
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_1UL,_0UL>::
  ~ListOf((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>,_1UL,_0UL>
           *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x20);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>,vtt + 5);
  IfcRepresentationItem::~IfcRepresentationItem((IfcRepresentationItem *)this,vtt + 1);
  return;
}

Assistant:

IfcStyledItem() : Object("IfcStyledItem") {}